

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateRoot.cpp
# Opt level: O0

ssize_t __thiscall
Vault::Sys::GenerateRoot::read_abi_cxx11_(GenerateRoot *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  GenerateRoot *this_00;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  Url local_38;
  GenerateRoot *local_18;
  GenerateRoot *this_local;
  
  this_00 = (GenerateRoot *)CONCAT44(in_register_00000034,__fd);
  client = *(Client **)this_00;
  local_18 = this_00;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"attempt",&local_79);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_58,&local_78);
  getUrl(&local_38,this_00,&local_58);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&local_38);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_38);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::GenerateRoot::read() {
  return HttpConsumer::get(client_, getUrl(Path{"attempt"}));
}